

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.hpp
# Opt level: O0

size_type trial::dynamic::value::count<std::allocator<char>,char16_t[6]>
                    (basic_variable<std::allocator<char>_> *self,char16_t (*other) [6])

{
  bool bVar1;
  type tVar2;
  value vVar3;
  const_reference lhs;
  const_iterator local_58;
  undefined1 local_40 [8];
  const_iterator it;
  size_type result;
  char16_t (*other_local) [6];
  basic_variable<std::allocator<char>_> *self_local;
  
  vVar3 = basic_variable<std::allocator<char>_>::symbol(self);
  if (vVar3 == null) {
    self_local = (basic_variable<std::allocator<char>_> *)0x0;
  }
  else if (vVar3 - boolean < 7) {
    tVar2 = dynamic::operator==(self,other);
    self_local = (basic_variable<std::allocator<char>_> *)(long)(int)(uint)tVar2;
  }
  else {
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .current.current = '\0';
    it.
    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    .current._9_7_ = 0;
    basic_variable<std::allocator<char>_>::begin((const_iterator *)local_40,self);
    while( true ) {
      basic_variable<std::allocator<char>_>::end(&local_58,self);
      bVar1 = basic_variable<std::allocator<char>_>::const_iterator::operator!=
                        ((const_iterator *)local_40,&local_58);
      basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_58);
      if (!bVar1) break;
      lhs = basic_variable<std::allocator<char>_>::const_iterator::operator*
                      ((const_iterator *)local_40);
      tVar2 = dynamic::operator==(lhs,other);
      if (tVar2) {
        it.
        super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
        .current._8_8_ =
             it.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_ + 1;
      }
      basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_40);
    }
    basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
              ((const_iterator *)local_40);
    self_local = (basic_variable<std::allocator<char>_> *)
                 it.
                 super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                 .current._8_8_;
  }
  return (size_type)self_local;
}

Assistant:

auto count(const basic_variable<Allocator>& self,
           const T& other) -> typename basic_variable<Allocator>::size_type
{
    switch (self.symbol())
    {
    case symbol::null:
        return 0;

    case symbol::boolean:
    case symbol::integer:
    case symbol::real:
    case symbol::string:
    case symbol::wstring:
    case symbol::u16string:
    case symbol::u32string:
        return (self == other) ? 1 : 0;

    case symbol::array:
    case symbol::map:
        {
            typename basic_variable<Allocator>::size_type result = 0;
            for (auto it = self.begin(); it != self.end(); ++it)
            {
                if (*it == other)
                    ++result;
            }
            return result;
        }
    }
    TRIAL_DYNAMIC_UNREACHABLE();
}